

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

UniquePtr<SSL_SESSION> __thiscall
bssl::anon_unknown_0::CreateClientSession
          (anon_unknown_0 *this,SSL_CTX *client_ctx,SSL_CTX *server_ctx,ClientConfig *config)

{
  bool bVar1;
  char *__ptr;
  anon_unknown_0 *paVar2;
  size_t sStack_40;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  
  std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
             &(anonymous_namespace)::g_last_session,(pointer)0x0);
  SSL_CTX_sess_set_new_cb((SSL_CTX *)client_ctx,SaveLastSession);
  client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
  server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
  bVar1 = ConnectClientAndServer(&client,&server,client_ctx,server_ctx,config,true);
  if (bVar1) {
    bVar1 = FlushNewSessionTickets
                      ((SSL *)client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                       (SSL *)server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    if (!bVar1) goto LAB_0016f8b2;
    SSL_CTX_sess_set_new_cb((SSL_CTX *)client_ctx,(new_session_cb *)0x0);
    if ((anonymous_namespace)::g_last_session != 0) {
      *(long *)this = (anonymous_namespace)::g_last_session;
      paVar2 = (anon_unknown_0 *)&(anonymous_namespace)::g_last_session;
      goto LAB_0016f88b;
    }
    __ptr = "Client did not receive a session.\n";
    sStack_40 = 0x22;
  }
  else {
LAB_0016f8b2:
    __ptr = "Failed to connect client and server.\n";
    sStack_40 = 0x25;
  }
  fwrite(__ptr,sStack_40,1,_stderr);
  paVar2 = this;
LAB_0016f88b:
  *(undefined8 *)paVar2 = 0;
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&client);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<SSL_SESSION> CreateClientSession(
    SSL_CTX *client_ctx, SSL_CTX *server_ctx,
    const ClientConfig &config = ClientConfig()) {
  g_last_session = nullptr;
  SSL_CTX_sess_set_new_cb(client_ctx, SaveLastSession);

  // Connect client and server to get a session.
  bssl::UniquePtr<SSL> client, server;
  if (!ConnectClientAndServer(&client, &server, client_ctx, server_ctx,
                              config) ||
      !FlushNewSessionTickets(client.get(), server.get())) {
    fprintf(stderr, "Failed to connect client and server.\n");
    return nullptr;
  }

  SSL_CTX_sess_set_new_cb(client_ctx, nullptr);

  if (!g_last_session) {
    fprintf(stderr, "Client did not receive a session.\n");
    return nullptr;
  }
  return std::move(g_last_session);
}